

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_scalars_test_json_parser.h
# Opt level: O1

char * optional_scalars_test_global_json_parser_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_type,uint64_t *value,
                 int *aggregate)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong *puVar5;
  char *mark;
  size_t n;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar2 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar2 = (long)buf[6] << 8;
    case 6:
      uVar2 = uVar2 | (long)buf[5] << 0x10;
    case 5:
      uVar2 = uVar2 | (long)buf[4] << 0x18;
    case 4:
      uVar2 = uVar2 | (long)buf[3] << 0x20;
    case 3:
      uVar2 = uVar2 | (long)buf[2] << 0x28;
    case 2:
      uVar2 = uVar2 | (long)buf[1] << 0x30;
    case 1:
      uVar2 = uVar2 | (ulong)(byte)*buf << 0x38;
    }
  }
  else {
    uVar2 = *(ulong *)buf;
    uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  }
  if (uVar2 == 0x6f7074696f6e616c) {
    puVar1 = (ulong *)(buf + 8);
    if ((ulong)((long)end - (long)puVar1) < 8) {
      uVar2 = 0;
      switch((long)end - (long)puVar1) {
      case 7:
        uVar2 = (long)buf[0xe] << 8;
      case 6:
        uVar2 = uVar2 | (long)buf[0xd] << 0x10;
      case 5:
        uVar2 = uVar2 | (long)buf[0xc] << 0x18;
      case 4:
        uVar2 = uVar2 | (long)buf[0xb] << 0x20;
      case 3:
        uVar2 = uVar2 | (long)buf[10] << 0x28;
      case 2:
        uVar2 = uVar2 | (long)buf[9] << 0x30;
      case 1:
        uVar2 = uVar2 | (ulong)(byte)*puVar1 << 0x38;
      }
    }
    else {
      uVar2 = *puVar1;
      uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
              | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18
              | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    if (uVar2 == 0x5f7363616c617273) {
      puVar1 = (ulong *)(buf + 0x10);
      if ((ulong)((long)end - (long)puVar1) < 8) {
        uVar2 = 0;
        switch((long)end - (long)puVar1) {
        case 7:
          uVar2 = (long)buf[0x16] << 8;
        case 6:
          uVar2 = uVar2 | (long)buf[0x15] << 0x10;
        case 5:
          uVar2 = uVar2 | (long)buf[0x14] << 0x18;
        case 4:
          uVar2 = uVar2 | (long)buf[0x13] << 0x20;
        case 3:
          uVar2 = uVar2 | (long)buf[0x12] << 0x28;
        case 2:
          uVar2 = uVar2 | (long)buf[0x11] << 0x30;
        case 1:
          uVar2 = uVar2 | (ulong)(byte)*puVar1 << 0x38;
        }
      }
      else {
        uVar2 = *puVar1;
        uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
      }
      if (uVar2 == 0x2e4f7074696f6e61) {
        puVar1 = (ulong *)(buf + 0x18);
        uVar2 = (long)end - (long)puVar1;
        if (uVar2 < 8) {
          uVar3 = 0;
          switch(uVar2) {
          case 7:
            uVar3 = (long)buf[0x1e] << 8;
          case 6:
            uVar3 = uVar3 | (long)buf[0x1d] << 0x10;
          case 5:
            uVar3 = uVar3 | (long)buf[0x1c] << 0x18;
          case 4:
            uVar3 = uVar3 | (long)buf[0x1b] << 0x20;
          case 3:
            uVar3 = uVar3 | (long)buf[0x1a] << 0x28;
          case 2:
            uVar3 = uVar3 | (long)buf[0x19] << 0x30;
          case 1:
            uVar3 = uVar3 | (ulong)(byte)*puVar1 << 0x38;
          }
        }
        else {
          uVar3 = *puVar1;
          uVar3 = (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
                  (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 |
                  (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
        }
        if (uVar3 == 0x6c466163746f7200) {
          puVar5 = puVar1;
          if ((7 < (long)uVar2) && (puVar5 = (ulong *)(buf + 0x20), buf[0x1f] != '.')) {
            puVar5 = puVar1;
          }
          if (puVar5 != puVar1) {
            pcVar4 = optional_scalars_OptionalFactor_parse_json_enum
                               (ctx,(char *)puVar5,end,value_type,value,aggregate);
            return pcVar4;
          }
        }
        else if (uVar3 >> 0x18 == 0x6c42797465) {
          puVar5 = puVar1;
          if ((5 < (long)uVar2) && (puVar5 = (ulong *)(buf + 0x1e), buf[0x1d] != '.')) {
            puVar5 = puVar1;
          }
          if (puVar5 != puVar1) {
            pcVar4 = optional_scalars_OptionalByte_parse_json_enum
                               (ctx,(char *)puVar5,end,value_type,value,aggregate);
            return pcVar4;
          }
        }
      }
    }
  }
  return buf;
}

Assistant:

static const char *optional_scalars_test_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_type, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w == 0x6f7074696f6e616c) { /* descend "optional" */
        buf += 8;
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w == 0x5f7363616c617273) { /* descend "_scalars" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w == 0x2e4f7074696f6e61) { /* descend ".Optiona" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x6c466163746f7200) { /* "lFactor" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 7);
                    if (buf != mark) {
                        buf = optional_scalars_OptionalFactor_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "lFactor" */
                    if ((w & 0xffffffffff000000) == 0x6c42797465000000) { /* "lByte" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 5);
                        if (buf != mark) {
                            buf = optional_scalars_OptionalByte_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "lByte" */
                        return unmatched;
                    } /* "lByte" */
                } /* "lFactor" */
            } else { /* descend ".Optiona" */
                return unmatched;
            } /* descend ".Optiona" */
        } else { /* descend "_scalars" */
            return unmatched;
        } /* descend "_scalars" */
    } else { /* descend "optional" */
        return unmatched;
    } /* descend "optional" */
    return buf;
}